

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::NodeTranslator
          (NodeTranslator *this,Resolver *resolver,ErrorReporter *errorReporter,Reader *decl,
          Orphan<capnp::schema::Node> *wipNodeParam,bool compileAnnotations)

{
  Reader decl_00;
  Builder builder;
  Builder builder_00;
  Orphanage OVar1;
  undefined8 in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  ListElementCount local_11c;
  SegmentReader *local_118;
  CapTableReader *pCStack_110;
  void *local_108;
  WirePointer *pWStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  unsigned_long local_e8;
  Builder local_e0;
  Reader local_b8;
  Builder local_88;
  Reader local_60;
  
  this->resolver = resolver;
  this->errorReporter = errorReporter;
  capnp::_::OrphanGetImpl<capnp::schema::Node,_(capnp::Kind)3>::apply
            (&local_88,&wipNodeParam->builder);
  builder_00._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffea8;
  builder_00._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffea0;
  builder_00._builder.data = (void *)in_stack_fffffffffffffeb0;
  builder_00._builder.pointers = (WirePointer *)in_stack_fffffffffffffeb8;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffffec0;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffec0 >> 0x30);
  OVar1 = Orphanage::getForMessageContaining<capnp::schema::Node::Builder>(builder_00);
  this->orphanage = OVar1;
  this->compileAnnotations = compileAnnotations;
  capnp::_::OrphanGetImpl<capnp::schema::Node,_(capnp::Kind)3>::applyReader
            (&local_b8,&wipNodeParam->builder);
  if (local_b8._reader.dataSize < 0x40) {
    local_e8 = 0;
  }
  else {
    local_e8 = *local_b8._reader.data;
  }
  Declaration::Reader::getParameters(&local_60,decl);
  local_11c = local_60.reader.elementCount;
  kj::
  refcounted<capnp::compiler::NodeTranslator::BrandScope,capnp::compiler::ErrorReporter&,unsigned_long,unsigned_int,capnp::compiler::NodeTranslator::Resolver&>
            ((kj *)&this->localBrand,errorReporter,&local_e8,&local_11c,resolver);
  capnp::_::OrphanBuilder::OrphanBuilder(&(this->wipNode).builder,&wipNodeParam->builder);
  Orphanage::newOrphan<capnp::schema::Node::SourceInfo>(&this->sourceInfo,&this->orphanage);
  (this->groups).builder.ptr = (AuxNode *)0x0;
  (this->groups).builder.pos = (RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *)0x0;
  (this->groups).builder.endPtr = (AuxNode *)0x0;
  (this->paramStructs).builder.endPtr = (AuxNode *)0x0;
  (this->paramStructs).builder.ptr = (AuxNode *)0x0;
  (this->paramStructs).builder.pos = (RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *)0x0;
  (this->unfinishedValues).builder.endPtr = (UnfinishedValue *)0x0;
  (this->unfinishedValues).builder.ptr = (UnfinishedValue *)0x0;
  (this->unfinishedValues).builder.pos =
       (RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *)0x0;
  local_118 = (decl->_reader).segment;
  pCStack_110 = (decl->_reader).capTable;
  local_108 = (decl->_reader).data;
  pWStack_100 = (decl->_reader).pointers;
  local_f8._0_4_ = (decl->_reader).dataSize;
  local_f8._4_2_ = (decl->_reader).pointerCount;
  local_f8._6_2_ = *(undefined2 *)&(decl->_reader).field_0x26;
  uStack_f0 = *(undefined8 *)&(decl->_reader).nestingLimit;
  capnp::_::OrphanGetImpl<capnp::schema::Node,_(capnp::Kind)3>::apply
            (&local_e0,&(this->wipNode).builder);
  decl_00._reader.capTable = pCStack_110;
  decl_00._reader.segment = local_118;
  decl_00._reader.data = local_108;
  decl_00._reader.pointers = pWStack_100;
  decl_00._reader.dataSize = (undefined4)local_f8;
  decl_00._reader.pointerCount = local_f8._4_2_;
  decl_00._reader._38_2_ = local_f8._6_2_;
  decl_00._reader._40_8_ = uStack_f0;
  builder._builder.capTable = local_e0._builder.capTable;
  builder._builder.segment = local_e0._builder.segment;
  builder._builder.data = local_e0._builder.data;
  builder._builder.pointers = local_e0._builder.pointers;
  builder._builder.dataSize = local_e0._builder.dataSize;
  builder._builder.pointerCount = local_e0._builder.pointerCount;
  builder._builder._38_2_ = local_e0._builder._38_2_;
  compileNode(this,decl_00,builder);
  return;
}

Assistant:

NodeTranslator::NodeTranslator(
    Resolver& resolver, ErrorReporter& errorReporter,
    const Declaration::Reader& decl, Orphan<schema::Node> wipNodeParam,
    bool compileAnnotations)
    : resolver(resolver), errorReporter(errorReporter),
      orphanage(Orphanage::getForMessageContaining(wipNodeParam.get())),
      compileAnnotations(compileAnnotations),
      localBrand(kj::refcounted<BrandScope>(
          errorReporter, wipNodeParam.getReader().getId(),
          decl.getParameters().size(), resolver)),
      wipNode(kj::mv(wipNodeParam)),
      sourceInfo(orphanage.newOrphan<schema::Node::SourceInfo>()) {
  compileNode(decl, wipNode.get());
}